

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<cs::tree_type<cs::token_base_*>_> * __thiscall
cs::
allocator_type<cs_impl::any::holder<cs::tree_type<cs::token_base*>>,64ul,cs_impl::default_allocator_provider>
::alloc<cs::tree_type<cs::token_base*>&>
          (allocator_type<cs_impl::any::holder<cs::tree_type<cs::token_base*>>,64ul,cs_impl::default_allocator_provider>
           *this,tree_type<cs::token_base_*> *args)

{
  long lVar1;
  holder<cs::tree_type<cs::token_base_*>_> *this_00;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    this_00 = (holder<cs::tree_type<cs::token_base_*>_> *)operator_new(0x10);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    this_00 = *(holder<cs::tree_type<cs::token_base_*>_> **)(this + lVar1 * 8 + -8);
  }
  cs_impl::any::holder<cs::tree_type<cs::token_base*>>::holder<cs::tree_type<cs::token_base*>&>
            ((holder<cs::tree_type<cs::token_base*>> *)this_00,args);
  return this_00;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}